

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackControl.cpp
# Opt level: O0

void __thiscall
trackerboy::TrackControl::TrackControl(TrackControl *this,ChType ch,FrequencyControl *fc)

{
  uint8_t uVar1;
  FrequencyControl *fc_local;
  ChType ch_local;
  TrackControl *this_local;
  
  Operation::Operation(&this->mOp);
  std::shared_ptr<const_trackerboy::Instrument>::shared_ptr(&this->mInstrument);
  this->mFc = fc;
  std::optional<trackerboy::InstrumentRuntime>::optional(&this->mIr);
  std::optional<unsigned_char>::optional(&this->mDelayCounter);
  std::optional<unsigned_char>::optional(&this->mCutCounter);
  this->mHasSweep = ch == ch1;
  this->mPlaying = false;
  uVar1 = ChannelState::defaultEnvelope(ch);
  this->mEnvelope = uVar1;
  uVar1 = ChannelState::defaultPanning(ch);
  this->mPanning = uVar1;
  uVar1 = ChannelState::defaultTimbre(ch);
  this->mTimbre = uVar1;
  return;
}

Assistant:

TrackControl::TrackControl(ChType ch, FrequencyControl &fc) :
    mOp(),
    mInstrument(),
    mFc(fc),
    mIr(),
    mDelayCounter(),
    mCutCounter(),
    mHasSweep(ch == ChType::ch1),
    mPlaying(false),
    mEnvelope(ChannelState::defaultEnvelope(ch)),
    mPanning(ChannelState::defaultPanning(ch)),
    mTimbre(ChannelState::defaultTimbre(ch))
{
}